

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leaf.cpp
# Opt level: O2

void duckdb::Leaf::TransformToDeprecated(ART *art,Node *node)

{
  FixedSizeAllocator *this;
  IndexPointer IVar1;
  Node ptr;
  Leaf *pLVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  unsafe_vector<row_t> row_ids;
  ARTKey empty_key;
  Iterator it;
  
  if ((long)(node->super_IndexPointer).data < 0) {
    row_ids.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    row_ids.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    row_ids.super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    Iterator::Iterator(&it,art);
    Iterator::FindMinimum(&it,node);
    ARTKey::ARTKey(&empty_key);
    Iterator::Scan(&it,&empty_key,0x7fffffffffffffff,&row_ids,false);
    Node::Free(art,node);
    lVar5 = 0;
    for (uVar6 = (long)row_ids.super_vector<long,_std::allocator<long>_>.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)row_ids.super_vector<long,_std::allocator<long>_>.
                       super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3; uVar6 != 0; uVar6 = uVar6 - uVar3) {
      this = Node::GetAllocator(art,LEAF);
      IVar1 = FixedSizeAllocator::New(this);
      ptr.super_IndexPointer.data =
           (IndexPointer)(IVar1.data & 0xffffffffffffff | 0x200000000000000);
      (node->super_IndexPointer).data = (idx_t)ptr.super_IndexPointer.data;
      pLVar2 = Node::Ref<duckdb::Leaf>(art,ptr,LEAF);
      uVar3 = 4;
      if (uVar6 < 4) {
        uVar3 = uVar6;
      }
      pLVar2->count = (uint8_t)uVar3;
      for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
        pLVar2->row_ids[uVar4] =
             row_ids.super_vector<long,_std::allocator<long>_>.
             super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar5 + uVar4];
      }
      lVar5 = lVar5 + uVar3;
      node = &pLVar2->ptr;
      (pLVar2->ptr).super_IndexPointer.data = 0;
    }
    Iterator::~Iterator(&it);
    ::std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
              ((_Vector_base<long,_std::allocator<long>_> *)&row_ids);
  }
  return;
}

Assistant:

void Leaf::TransformToDeprecated(ART &art, Node &node) {
	D_ASSERT(node.GetGateStatus() == GateStatus::GATE_SET || node.GetType() == LEAF);

	// Early-out, if we never transformed this leaf.
	if (node.GetGateStatus() == GateStatus::GATE_NOT_SET) {
		return;
	}

	// Collect all row IDs and free the nested leaf.
	unsafe_vector<row_t> row_ids;
	Iterator it(art);
	it.FindMinimum(node);
	ARTKey empty_key = ARTKey();
	it.Scan(empty_key, NumericLimits<row_t>().Maximum(), row_ids, false);
	Node::Free(art, node);
	D_ASSERT(row_ids.size() > 1);

	// Create the deprecated leaves.
	idx_t remaining = row_ids.size();
	idx_t copy_count = 0;
	reference<Node> ref(node);
	while (remaining) {
		ref.get() = Node::GetAllocator(art, LEAF).New();
		ref.get().SetMetadata(static_cast<uint8_t>(LEAF));

		auto &leaf = Node::Ref<Leaf>(art, ref, LEAF);
		auto min = MinValue(UnsafeNumericCast<idx_t>(LEAF_SIZE), remaining);
		leaf.count = UnsafeNumericCast<uint8_t>(min);

		for (uint8_t i = 0; i < leaf.count; i++) {
			leaf.row_ids[i] = row_ids[copy_count + i];
		}

		copy_count += leaf.count;
		remaining -= leaf.count;

		ref = leaf.ptr;
		leaf.ptr.Clear();
	}
}